

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PEFile.cpp
# Opt level: O1

bool __thiscall PEFile::_canAddNewSection(PEFile *this)

{
  char cVar1;
  int iVar2;
  undefined4 extraout_var;
  long *plVar3;
  bool bVar4;
  bool isOk;
  
  iVar2 = (*(this->super_MappedExe).super_ExeWrappersContainer._vptr_ExeWrappersContainer[2])
                    (&(this->super_MappedExe).super_ExeWrappersContainer,5);
  if (CONCAT44(extraout_var,iVar2) == 0) {
    plVar3 = (long *)0x0;
  }
  else {
    plVar3 = (long *)__dynamic_cast(CONCAT44(extraout_var,iVar2),&ExeElementWrapper::typeinfo,
                                    &ExeNodeWrapper::typeinfo,0);
  }
  if ((plVar3 == (long *)0x0) || (cVar1 = (**(code **)(*plVar3 + 0x138))(plVar3), cVar1 == '\0')) {
    bVar4 = false;
  }
  else {
    (*(this->fHdr->super_PEElementWrapper).super_ExeElementWrapper.super_AbstractByteBuffer.
      _vptr_AbstractByteBuffer[0x1c])(this->fHdr,1,0xffffffffffffffff);
    bVar4 = SectHdrsWrapper::SECT_COUNT_MAX != 0;
  }
  return bVar4;
}

Assistant:

bool PEFile::_canAddNewSection()
{
    ExeNodeWrapper* sec = dynamic_cast<ExeNodeWrapper*>(getWrapper(PEFile::WR_SECTIONS));
    if (sec == NULL || sec->canAddEntry() == false) {
        return false;
    }
    const size_t secCount = hdrSectionsNum();
    if (secCount == SectHdrsWrapper::SECT_COUNT_MAX) {
        return false; //limit exceeded
    }
    //TODO: some more checks? overlay?
    return true;
}